

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::DebugWriter::PrintEscapedString(DebugWriter *this,Char *str,CharCount len)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Char *local_30;
  Char *p;
  Char *pl;
  CharCount len_local;
  Char *str_local;
  DebugWriter *this_local;
  
  if (str == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/DebugWriter.cpp"
                       ,0x2c,"(str != 0)","str != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckForNewline(this);
  for (local_30 = str; local_30 < str + len; local_30 = local_30 + 1) {
    if (*local_30 == L'\"') {
      Output::Print(L"\\\"");
    }
    else {
      PrintEscapedChar(this,*local_30);
    }
  }
  return;
}

Assistant:

void DebugWriter::PrintEscapedString(const Char* str, CharCount len)
    {
        Assert(str != 0);
        CheckForNewline();

        const Char* pl = str + len;
        for (const Char* p = str; p < pl; p++)
        {
            if (*p == '"')
                Output::Print(_u("\\\""));
            else
                PrintEscapedChar(*p);
        }
    }